

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_holy_word(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  char *pcVar2;
  bool bVar3;
  int sn_00;
  int sn_01;
  int sn_02;
  int sn_03;
  int iVar4;
  undefined8 uVar5;
  CHAR_DATA *ch_00;
  
  bVar3 = is_good(ch);
  pcVar2 = "unholy dark wrath";
  if (bVar3) {
    pcVar2 = "divine wrath";
  }
  sn_00 = skill_lookup(pcVar2 + 7);
  skill_lookup("sanctuary");
  sn_01 = skill_lookup("bless");
  sn_02 = skill_lookup("curse");
  sn_03 = skill_lookup("frenzy");
  uVar5 = 0;
  act("$n utters a word of divine power!",ch,(void *)0x0,(void *)0x0,0);
  send_to_char("You utter a word of divine power.\n\r",ch);
  ch_00 = ch->in_room->people;
  if (ch_00 != (CHAR_DATA *)0x0) {
    do {
      pCVar1 = ch_00->next_in_room;
      if (ch_00->invis_level < 0x34) {
        bVar3 = is_good(ch);
        if (bVar3) {
          bVar3 = is_good(ch_00);
          iVar4 = (int)uVar5;
          if (!bVar3) goto LAB_002ae704;
LAB_002ae73c:
          send_to_char("You feel more powerful.\n\r",ch_00);
          spell_frenzy(sn_03,level,ch,ch_00,iVar4);
          uVar5 = 0;
          spell_bless(sn_01,level,ch,ch_00,0);
        }
        else {
LAB_002ae704:
          bVar3 = is_evil(ch);
          if (bVar3) {
            bVar3 = is_evil(ch_00);
            iVar4 = (int)uVar5;
            if (bVar3) goto LAB_002ae73c;
          }
          bVar3 = is_neutral(ch);
          if (bVar3) {
            bVar3 = is_neutral(ch_00);
            iVar4 = (int)uVar5;
            if (ch_00 == ch && bVar3) goto LAB_002ae73c;
          }
          bVar3 = is_good(ch);
          if (((bVar3) && (bVar3 = is_evil(ch_00), bVar3)) ||
             ((bVar3 = is_evil(ch), bVar3 && (bVar3 = is_good(ch_00), bVar3)))) {
            bVar3 = is_safe_spell(ch,ch_00,true);
            if (!bVar3) {
              spell_curse(sn_02,level,ch,ch_00,(int)uVar5);
              send_to_char("You are struck down!\n\r",ch_00);
              bVar3 = is_good(ch);
              if (bVar3) {
                spell_wrath(sn_00,level,ch,ch_00,(int)uVar5);
              }
              else {
                spell_dark_wrath(sn_00,level,ch,ch_00,(int)uVar5);
              }
            }
          }
          else {
            bVar3 = is_neutral(ch);
            if ((bVar3) && (bVar3 = is_safe_spell(ch,ch_00,true), !bVar3)) {
              spell_curse(sn_02,level / 2,ch,ch_00,(int)uVar5);
              send_to_char("You are struck down!\n\r",ch_00);
              iVar4 = dice(level,4);
              uVar5 = 0xb;
              damage_old(ch,ch_00,iVar4,sn,0xb,true);
            }
          }
        }
      }
      ch_00 = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  send_to_char("You feel drained.\n\r",ch);
  ch->hit = ch->hit + -100;
  return;
}

Assistant:

void spell_holy_word(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	int dam;
	int bless_num, curse_num, frenzy_num, sanc_num;
	int wrath_num;

	if (is_good(ch))
		wrath_num = skill_lookup("wrath");
	else
		wrath_num = skill_lookup("dark wrath");

	sanc_num = skill_lookup("sanctuary");
	bless_num = skill_lookup("bless");
	curse_num = skill_lookup("curse");
	frenzy_num = skill_lookup("frenzy");

	act("$n utters a word of divine power!", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You utter a word of divine power.\n\r", ch);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (vch->invis_level > LEVEL_HERO)
			continue;

		if ((is_good(ch) && is_good(vch))
			|| (is_evil(ch) && is_evil(vch))
			|| ((is_neutral(ch) && is_neutral(vch)) && ch == vch))
		{
			send_to_char("You feel more powerful.\n\r", vch);
			spell_frenzy(frenzy_num, level, ch, (void *)vch, TARGET_CHAR);
			spell_bless(bless_num, level, ch, (void *)vch, TARGET_CHAR);
		}
		else if ((is_good(ch) && is_evil(vch))
			|| (is_evil(ch) && is_good(vch)))
		{
			if (!is_safe_spell(ch, vch, true))
			{
				spell_curse(curse_num, level, ch, (void *)vch, TARGET_CHAR);
				send_to_char("You are struck down!\n\r", vch);

				if (is_good(ch))
					spell_wrath(wrath_num, level, ch, (void *)vch, TARGET_CHAR);
				else
					spell_dark_wrath(wrath_num, level, ch, (void *)vch, TARGET_CHAR);

				/*
				dam = dice(level,6);
				damage_old(ch,vch,dam,sn,DAM_ENERGY,true);
				*/
			}
		}
		else if (is_neutral(ch))
		{
			if (!is_safe_spell(ch, vch, true))
			{
				spell_curse(curse_num, level / 2, ch, (void *)vch, TARGET_CHAR);
				send_to_char("You are struck down!\n\r", vch);
				dam = dice(level, 4);
				damage_old(ch, vch, dam, sn, DAM_ENERGY, true);
			}
		}
	}

	send_to_char("You feel drained.\n\r", ch);
	ch->hit -= 100;
}